

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

bool ValidatePlayerClass(PClassActor *ti,char *name)

{
  bool bVar1;
  char *format;
  
  if (ti == (PClassActor *)0x0) {
    format = "Unknown player class \'%s\'\n";
  }
  else {
    bVar1 = PClass::IsAncestorOf(APlayerPawn::RegistrationInfo.MyClass,&ti->super_PClass);
    if (bVar1) {
      if (*(int *)(*(long *)&ti[1].super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.super_PTypeBase + -0xc) != 0) {
        return true;
      }
      format = "Missing displayname for player class \'%s\'\n";
    }
    else {
      format = "Invalid player class \'%s\'\n";
    }
  }
  Printf(format,name);
  return false;
}

Assistant:

bool ValidatePlayerClass(PClassActor *ti, const char *name)
{
	if (ti == NULL)
	{
		Printf("Unknown player class '%s'\n", name);
		return false;
	}
	else if (!ti->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Printf("Invalid player class '%s'\n", name);
		return false;
	}
	else if (static_cast<PClassPlayerPawn *>(ti)->DisplayName.IsEmpty())
	{
		Printf ("Missing displayname for player class '%s'\n", name);
		return false;
	}
	return true;
}